

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::DoTrackIntOverflow(BackwardPass *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  byte local_11;
  BackwardPass *this_local;
  
  uVar2 = Func::GetSourceContextId(this->func);
  uVar3 = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,TrackIntUsagePhase,uVar2,uVar3);
  local_11 = 0;
  if (!bVar1) {
    uVar2 = Func::GetSourceContextId(this->func);
    uVar3 = Func::GetLocalFunctionId(this->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,TrackIntOverflowPhase,uVar2,uVar3);
    local_11 = 0;
    if ((!bVar1) && (local_11 = 0, this->tag == BackwardPhase)) {
      bVar1 = IsPrePass(this);
      local_11 = 0;
      if (!bVar1) {
        bVar1 = GlobOpt::DoLossyIntTypeSpec(this->globOpt);
        local_11 = 0;
        if (bVar1) {
          bVar1 = Func::IsJitInDebugMode(this->func);
          local_11 = bVar1 ^ 0xff;
        }
      }
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool
BackwardPass::DoTrackIntOverflow() const
{
    return
        !PHASE_OFF(Js::TrackIntUsagePhase, func) &&
        !PHASE_OFF(Js::TrackIntOverflowPhase, func) &&
        tag == Js::BackwardPhase &&
        !IsPrePass() &&
        globOpt->DoLossyIntTypeSpec() &&
        !func->IsJitInDebugMode();
}